

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O2

void ritobin::io::json_impl::json_value_impl<ritobin::Map,_(ritobin::Category)7>::to_json_info
               (Map *value,json *json)

{
  pointer pPVar1;
  reference json_00;
  Pair *item;
  pointer value_00;
  initializer_list_t init;
  string key;
  json key_json;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  init._M_len = 0;
  init._M_array = (iterator)&local_60;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::object(init);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(json,&local_60);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_60);
  pPVar1 = (value->items).super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (value_00 = (value->items).super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>.
                  _M_impl.super__Vector_impl_data._M_start; value_00 != pPVar1;
      value_00 = value_00 + 1) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&key_json,(nullptr_t)0x0);
    value_to_json_info(&value_00->key,&key_json);
    key._M_dataplus._M_p = (pointer)&key.field_2;
    key._M_string_length = 0;
    key.field_2._M_local_buf[0] = '\0';
    if (key_json.m_type == string) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_50,&key_json);
    }
    else {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::dump(&local_50,&key_json,-1,' ',false,strict);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&key,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    json_00 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator[](json,&key);
    value_to_json_info(&value_00->value,json_00);
    std::__cxx11::string::~string((string *)&key);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&key_json);
  }
  return;
}

Assistant:

static void to_json_info(T const& value, json& json) noexcept {
            json = json::object();
            for (auto const& item: value.items) {
                nlohmann::json key_json = {};
                value_to_json_info(item.key, key_json);
                std::string key;
                if (key_json.is_string()) {
                    key = key_json;
                } else {
                    key = key_json.dump();
                }
                value_to_json_info(item.value, json[key]);
            }
        }